

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall QSplitter::setOrientation(QSplitter *this,Orientation orientation)

{
  long lVar1;
  bool bVar2;
  QSplitterPrivate *pQVar3;
  long lVar4;
  qsizetype qVar5;
  Orientation in_ESI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000013;
  WidgetAttribute in_stack_00000014;
  undefined7 in_stack_00000018;
  bool in_stack_0000001f;
  QSplitterLayoutStruct *s;
  int i;
  QSplitterPrivate *d;
  qsizetype in_stack_ffffffffffffffa8;
  QWidget *in_stack_ffffffffffffffb0;
  QWidget *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc8;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  int local_30;
  
  policy.data = (quint32)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSplitter *)0x69c56e);
  if (pQVar3->orient != in_ESI) {
    bVar2 = QWidget::testAttribute
                      (in_stack_ffffffffffffffb8,
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    if (!bVar2) {
      QWidget::sizePolicy(in_stack_ffffffffffffffb0);
      QSizePolicy::transposed((QSizePolicy *)in_stack_ffffffffffffffb0);
      QWidget::setSizePolicy(in_RDI,(QSizePolicy)policy);
      QWidget::setAttribute
                ((QWidget *)CONCAT17(in_stack_0000001f,in_stack_00000018),in_stack_00000014,
                 in_stack_00000013);
    }
    pQVar3->orient = in_ESI;
    local_30 = 0;
    while( true ) {
      lVar4 = (long)local_30;
      qVar5 = QList<QSplitterLayoutStruct_*>::size(&pQVar3->list);
      if (qVar5 <= lVar4) break;
      QList<QSplitterLayoutStruct_*>::at
                ((QList<QSplitterLayoutStruct_*> *)in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      QSplitterHandle::setOrientation((QSplitterHandle *)in_RDI,(Orientation)((ulong)lVar4 >> 0x20))
      ;
      local_30 = local_30 + 1;
    }
    QWidget::isVisible((QWidget *)0x69c667);
    QSplitterPrivate::recalc((QSplitterPrivate *)s,in_stack_0000001f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSplitter::setOrientation(Qt::Orientation orientation)
{
    Q_D(QSplitter);
    if (d->orient == orientation)
        return;

    if (!testAttribute(Qt::WA_WState_OwnSizePolicy)) {
        setSizePolicy(sizePolicy().transposed());
        setAttribute(Qt::WA_WState_OwnSizePolicy, false);
    }

    d->orient = orientation;

    for (int i = 0; i < d->list.size(); ++i) {
        QSplitterLayoutStruct *s = d->list.at(i);
        s->handle->setOrientation(orientation);
    }
    d->recalc(isVisible());
}